

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O0

int lyplg_type_sort_uint(ly_ctx *UNUSED_ctx,lyd_value *val1,lyd_value *val2)

{
  lyd_value *val2_local;
  lyd_value *val1_local;
  ly_ctx *UNUSED_ctx_local;
  
  switch(val1->realtype->basetype) {
  case LY_TYPE_UINT8:
    if ((val1->field_2).uint8 < (val2->field_2).uint8) {
      UNUSED_ctx_local._4_4_ = -1;
    }
    else if ((val2->field_2).uint8 < (val1->field_2).uint8) {
      UNUSED_ctx_local._4_4_ = 1;
    }
    else {
      UNUSED_ctx_local._4_4_ = 0;
    }
    break;
  case LY_TYPE_UINT16:
    if ((val1->field_2).uint16 < (val2->field_2).uint16) {
      UNUSED_ctx_local._4_4_ = -1;
    }
    else if ((val2->field_2).uint16 < (val1->field_2).uint16) {
      UNUSED_ctx_local._4_4_ = 1;
    }
    else {
      UNUSED_ctx_local._4_4_ = 0;
    }
    break;
  case LY_TYPE_UINT32:
    if ((val1->field_2).uint32 < (val2->field_2).uint32) {
      UNUSED_ctx_local._4_4_ = -1;
    }
    else if ((val2->field_2).uint32 < (val1->field_2).uint32) {
      UNUSED_ctx_local._4_4_ = 1;
    }
    else {
      UNUSED_ctx_local._4_4_ = 0;
    }
    break;
  case LY_TYPE_UINT64:
    if ((val1->field_2).uint64 < (val2->field_2).uint64) {
      UNUSED_ctx_local._4_4_ = -1;
    }
    else if ((val2->field_2).uint64 < (val1->field_2).uint64) {
      UNUSED_ctx_local._4_4_ = 1;
    }
    else {
      UNUSED_ctx_local._4_4_ = 0;
    }
    break;
  default:
    UNUSED_ctx_local._4_4_ = 0;
  }
  return UNUSED_ctx_local._4_4_;
}

Assistant:

LIBYANG_API_DEF int
lyplg_type_sort_uint(const struct ly_ctx *UNUSED(ctx), const struct lyd_value *val1, const struct lyd_value *val2)
{
    switch (val1->realtype->basetype) {
    case LY_TYPE_UINT8:
        if (val1->uint8 < val2->uint8) {
            return -1;
        } else if (val1->uint8 > val2->uint8) {
            return 1;
        } else {
            return 0;
        }
        break;
    case LY_TYPE_UINT16:
        if (val1->uint16 < val2->uint16) {
            return -1;
        } else if (val1->uint16 > val2->uint16) {
            return 1;
        } else {
            return 0;
        }
        break;
    case LY_TYPE_UINT32:
        if (val1->uint32 < val2->uint32) {
            return -1;
        } else if (val1->uint32 > val2->uint32) {
            return 1;
        } else {
            return 0;
        }
        break;
    case LY_TYPE_UINT64:
        if (val1->uint64 < val2->uint64) {
            return -1;
        } else if (val1->uint64 > val2->uint64) {
            return 1;
        } else {
            return 0;
        }
        break;
    default:
        break;
    }
    return 0;
}